

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void __thiscall memory_tree_ns::memory_tree::memory_tree(memory_tree *this)

{
  (this->nodes).end_array = (node *)0x0;
  (this->nodes).erase_count = 0;
  (this->nodes)._begin = (node *)0x0;
  (this->nodes)._end = (node *)0x0;
  (this->examples)._begin = (example **)0x0;
  (this->examples)._end = (example **)0x0;
  (this->examples).end_array = (example **)0x0;
  (this->examples).erase_count = 0;
  this->alpha = 0.5;
  this->routers_used = 0;
  this->iter = 0;
  this->test_mode = false;
  this->max_depth = 0;
  this->max_ex_in_leaf = 0;
  *(undefined8 *)((long)&this->max_ex_in_leaf + 4) = 0;
  this->test_time = 0.0;
  this->num_mistakes = 0;
  this->top_K = 1;
  return;
}

Assistant:

memory_tree()
        {
            nodes = v_init<node>();
            examples = v_init<example*>();
            alpha = 0.5;
            routers_used = 0;
            iter = 0;
            num_mistakes = 0;
            test_mode = false;
            max_depth = 0;
            max_ex_in_leaf = 0;
            construct_time = 0;
            test_time = 0;
            top_K = 1;
        }